

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseAtomTypesSectionParser.cpp
# Opt level: O0

void __thiscall
OpenMD::BaseAtomTypesSectionParser::parseLine
          (BaseAtomTypesSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  bool bVar1;
  int iVar2;
  AtomType *this_00;
  SimpleTypeData<double> *this_01;
  uint in_ECX;
  string *in_RDX;
  RealType nelectron;
  RealType mass;
  int ident;
  AtomType *baseAtomType;
  string baseAtomTypeName;
  int nTokens;
  StringTokenizer tokenizer;
  SimpleTypeData<double> *in_stack_fffffffffffffe68;
  AtomType *in_stack_fffffffffffffe70;
  StringTokenizer *in_stack_fffffffffffffe78;
  StringTokenizer *in_stack_fffffffffffffe80;
  string *in_stack_fffffffffffffea0;
  AtomType *in_stack_fffffffffffffea8;
  ForceField *in_stack_fffffffffffffeb0;
  RealType in_stack_fffffffffffffeb8;
  errorStruct *peVar3;
  undefined4 in_stack_fffffffffffffec0;
  ForceField *this_02;
  allocator<char> local_121;
  AtomType *in_stack_fffffffffffffee0;
  shared_ptr<OpenMD::GenericData> *in_stack_fffffffffffffee8;
  AtomType *in_stack_fffffffffffffef0;
  StringTokenizer *in_stack_ffffffffffffff18;
  AtomType *local_d8;
  string local_d0 [32];
  int local_b0;
  undefined1 local_99 [125];
  uint local_1c;
  
  this_02 = (ForceField *)local_99;
  local_1c = in_ECX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffeb0,(char *)in_stack_fffffffffffffea8,
             (allocator<char> *)in_stack_fffffffffffffea0);
  StringTokenizer::StringTokenizer
            ((StringTokenizer *)in_stack_fffffffffffffeb0,(string *)in_stack_fffffffffffffea8,
             in_stack_fffffffffffffea0);
  std::__cxx11::string::~string((string *)(local_99 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_99);
  iVar2 = StringTokenizer::countTokens(in_stack_fffffffffffffe80);
  local_b0 = iVar2;
  if (iVar2 < 2) {
    peVar3 = &painCave;
    snprintf(painCave.errMsg,2000,"BaseAtomTypesSectionParser Error: Not enough tokens at line %d\n"
             ,(ulong)local_1c);
    peVar3->isFatal = 1;
    simError();
  }
  else {
    StringTokenizer::nextToken_abi_cxx11_(in_stack_ffffffffffffff18);
    this_00 = ForceField::getAtomType(in_stack_fffffffffffffeb0,(string *)in_stack_fffffffffffffea8)
    ;
    local_d8 = this_00;
    if (this_00 == (AtomType *)0x0) {
      local_d8 = (AtomType *)operator_new(0xf8);
      AtomType::AtomType(in_stack_fffffffffffffee0);
      in_stack_fffffffffffffea8 = local_d8;
      in_stack_fffffffffffffea0 = (string *)ForceField::getNAtomType((ForceField *)0x21bafb);
      AtomType::setIdent(local_d8,(int)in_stack_fffffffffffffea0);
      AtomType::setName(in_stack_fffffffffffffe70,(string *)in_stack_fffffffffffffe68);
      ForceField::addAtomType(this_02,in_RDX,(AtomType *)CONCAT44(iVar2,in_stack_fffffffffffffec0));
    }
    StringTokenizer::nextTokenAsDouble((StringTokenizer *)this_00);
    AtomType::setMass((AtomType *)CONCAT44(iVar2,in_stack_fffffffffffffec0),
                      in_stack_fffffffffffffeb8);
    bVar1 = StringTokenizer::hasMoreTokens(in_stack_fffffffffffffe78);
    if (bVar1) {
      StringTokenizer::nextTokenAsDouble((StringTokenizer *)this_00);
      this_01 = (SimpleTypeData<double> *)operator_new(0x30);
      in_stack_fffffffffffffe70 = (AtomType *)&local_121;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                 (char *)in_stack_fffffffffffffea8,(allocator<char> *)in_stack_fffffffffffffea0);
      SimpleTypeData<double>::SimpleTypeData
                (this_01,(string *)local_d8,(double *)in_stack_fffffffffffffe70);
      std::shared_ptr<OpenMD::GenericData>::shared_ptr<OpenMD::SimpleTypeData<double>,void>
                ((shared_ptr<OpenMD::GenericData> *)in_stack_fffffffffffffe70,
                 in_stack_fffffffffffffe68);
      AtomType::addProperty(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x21bcba)
      ;
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffee0);
      std::allocator<char>::~allocator(&local_121);
    }
    std::__cxx11::string::~string(local_d0);
  }
  StringTokenizer::~StringTokenizer((StringTokenizer *)in_stack_fffffffffffffe70);
  return;
}

Assistant:

void BaseAtomTypesSectionParser::parseLine(ForceField& ff,
                                             const std::string& line,
                                             int lineNo) {
    StringTokenizer tokenizer(line);
    int nTokens = tokenizer.countTokens();

    // in BaseAtomTypeSection, a line at least contains 2 tokens
    // atomTypeName and mass
    if (nTokens < 2) {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "BaseAtomTypesSectionParser Error: Not enough tokens at line %d\n",
          lineNo);
      painCave.isFatal = 1;
      simError();

    } else {
      std::string baseAtomTypeName = tokenizer.nextToken();
      AtomType* baseAtomType       = ff.getAtomType(baseAtomTypeName);

      if (baseAtomType == NULL) {
        baseAtomType = new AtomType();
        int ident    = ff.getNAtomType();
        baseAtomType->setIdent(ident);
        baseAtomType->setName(baseAtomTypeName);
        ff.addAtomType(baseAtomTypeName, baseAtomType);
      }

      //    else {
      //         snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
      //         "BaseAtomTypesSectionParser Error: Duplicate BaseAtomType at
      //         line %d\n",
      //                 lineNo);
      //         painCave.isFatal = 1;
      //         simError();
      //       }

      RealType mass = tokenizer.nextTokenAsDouble();
      baseAtomType->setMass(mass);
      if (tokenizer.hasMoreTokens()) {
        RealType nelectron = tokenizer.nextTokenAsDouble();
        baseAtomType->addProperty(std::shared_ptr<GenericData>(
            new DoubleGenericData("nelectron", nelectron)));
      }
    }
  }